

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

CURLcode resolve_server(Curl_easy *data,connectdata *conn,_Bool *async)

{
  int iVar1;
  Curl_dns_entry *in_RAX;
  timediff_t timeoutms;
  CURLcode CVar2;
  ulong uVar3;
  long lVar4;
  Curl_dns_entry *hostaddr;
  Curl_dns_entry *local_28;
  
  local_28 = in_RAX;
  timeoutms = Curl_timeleft(data,(curltime *)0x0,true);
  if ((conn->bits).reuse == true) {
    *async = false;
    return CURLE_OK;
  }
  if ((conn->bits).proxy == false) {
    lVar4 = 0xc0;
    if ((conn->bits).conn_to_host != false) {
      lVar4 = 0xe8;
    }
    iVar1 = *(int *)(conn->primary_ip + (ulong)(conn->bits).conn_to_port * 4 + -10);
    conn->port = (long)iVar1;
    iVar1 = Curl_resolv_timeout(conn,*(char **)((conn->chunk).hexbuffer + lVar4 + -0x10),iVar1,
                                &local_28,timeoutms);
    if (iVar1 == -2) goto LAB_00435032;
    if (iVar1 == 1) goto LAB_0043502c;
    if (local_28 == (Curl_dns_entry *)0x0) {
      Curl_failf(data,"Couldn\'t resolve host \'%s\'",
                 *(undefined8 *)((conn->chunk).hexbuffer + lVar4 + -8));
      CVar2 = CURLE_COULDNT_RESOLVE_HOST;
      goto LAB_00435044;
    }
  }
  else {
    uVar3 = (ulong)(((conn->bits).socksproxy ^ 1) << 6);
    iVar1 = Curl_resolv_timeout(conn,*(char **)((long)&(conn->socks_proxy).host.name + uVar3),
                                (int)conn->port,&local_28,timeoutms);
    if (iVar1 == -2) {
LAB_00435032:
      CVar2 = CURLE_OPERATION_TIMEDOUT;
      goto LAB_00435044;
    }
    if (iVar1 == 1) {
LAB_0043502c:
      *async = true;
    }
    else if (local_28 == (Curl_dns_entry *)0x0) {
      Curl_failf(data,"Couldn\'t resolve proxy \'%s\'",
                 *(undefined8 *)((conn->chunk).hexbuffer + ((uVar3 | 0x108) - 8)));
      CVar2 = CURLE_COULDNT_RESOLVE_PROXY;
      goto LAB_00435044;
    }
  }
  CVar2 = CURLE_OK;
LAB_00435044:
  conn->dns_entry = local_28;
  return CVar2;
}

Assistant:

static CURLcode resolve_server(struct Curl_easy *data,
                               struct connectdata *conn,
                               bool *async)
{
  CURLcode result = CURLE_OK;
  timediff_t timeout_ms = Curl_timeleft(data, NULL, TRUE);

  /*************************************************************
   * Resolve the name of the server or proxy
   *************************************************************/
  if(conn->bits.reuse)
    /* We're reusing the connection - no need to resolve anything, and
       fix_hostname() was called already in create_conn() for the re-use
       case. */
    *async = FALSE;

  else {
    /* this is a fresh connect */
    int rc;
    struct Curl_dns_entry *hostaddr;

#ifdef USE_UNIX_SOCKETS
    if(conn->unix_domain_socket) {
      /* Unix domain sockets are local. The host gets ignored, just use the
       * specified domain socket address. Do not cache "DNS entries". There is
       * no DNS involved and we already have the filesystem path available */
      const char *path = conn->unix_domain_socket;

      hostaddr = calloc(1, sizeof(struct Curl_dns_entry));
      if(!hostaddr)
        result = CURLE_OUT_OF_MEMORY;
      else {
        bool longpath = FALSE;
        hostaddr->addr = Curl_unix2addr(path, &longpath,
                                        conn->abstract_unix_socket);
        if(hostaddr->addr)
          hostaddr->inuse++;
        else {
          /* Long paths are not supported for now */
          if(longpath) {
            failf(data, "Unix socket path too long: '%s'", path);
            result = CURLE_COULDNT_RESOLVE_HOST;
          }
          else
            result = CURLE_OUT_OF_MEMORY;
          free(hostaddr);
          hostaddr = NULL;
        }
      }
    }
    else
#endif
    if(!conn->bits.proxy) {
      struct hostname *connhost;
      if(conn->bits.conn_to_host)
        connhost = &conn->conn_to_host;
      else
        connhost = &conn->host;

      /* If not connecting via a proxy, extract the port from the URL, if it is
       * there, thus overriding any defaults that might have been set above. */
      if(conn->bits.conn_to_port)
        conn->port = conn->conn_to_port;
      else
        conn->port = conn->remote_port;

      /* Resolve target host right on */
      rc = Curl_resolv_timeout(conn, connhost->name, (int)conn->port,
                               &hostaddr, timeout_ms);
      if(rc == CURLRESOLV_PENDING)
        *async = TRUE;

      else if(rc == CURLRESOLV_TIMEDOUT)
        result = CURLE_OPERATION_TIMEDOUT;

      else if(!hostaddr) {
        failf(data, "Couldn't resolve host '%s'", connhost->dispname);
        result =  CURLE_COULDNT_RESOLVE_HOST;
        /* don't return yet, we need to clean up the timeout first */
      }
    }
    else {
      /* This is a proxy that hasn't been resolved yet. */

      struct hostname * const host = conn->bits.socksproxy ?
        &conn->socks_proxy.host : &conn->http_proxy.host;

      /* resolve proxy */
      rc = Curl_resolv_timeout(conn, host->name, (int)conn->port,
                               &hostaddr, timeout_ms);

      if(rc == CURLRESOLV_PENDING)
        *async = TRUE;

      else if(rc == CURLRESOLV_TIMEDOUT)
        result = CURLE_OPERATION_TIMEDOUT;

      else if(!hostaddr) {
        failf(data, "Couldn't resolve proxy '%s'", host->dispname);
        result = CURLE_COULDNT_RESOLVE_PROXY;
        /* don't return yet, we need to clean up the timeout first */
      }
    }
    DEBUGASSERT(conn->dns_entry == NULL);
    conn->dns_entry = hostaddr;
  }

  return result;
}